

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator>::Lookup
          (PrimitiveDictionary<duckdb::uhugeint_t,_double,_duckdb::ParquetUhugeintOperator> *this,
          uhugeint_t *value)

{
  char cVar1;
  ulong uVar2;
  primitive_dictionary_entry_t *this_00;
  
  uVar2 = duckdb::Hash<duckdb::uhugeint_t>(*value);
  uVar2 = uVar2 & this->capacity_mask;
  if (this->dictionary[uVar2].index != 0xffffffff) {
    this_00 = this->dictionary + uVar2;
    do {
      cVar1 = duckdb::uhugeint_t::operator!=(&this_00->value,value);
      if (cVar1 == '\0') break;
      uVar2 = uVar2 + 1 & this->capacity_mask;
      this_00 = this->dictionary + uVar2;
    } while (this_00->index != 0xffffffff);
  }
  return this->dictionary + uVar2;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}